

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

bool __thiscall jrtplib::RTCPSDESPacket::GotoNextChunk(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if ((((this->super_RTCPPacket).knownformat == true) &&
      (puVar1 = this->currentchunk, puVar1 != (uint8_t *)0x0)) &&
     (this->curchunknum != (*(this->super_RTCPPacket).data & 0x1f))) {
    for (lVar2 = 4; puVar1[lVar2] != '\0'; lVar2 = lVar2 + (ulong)puVar1[lVar2 + 1] + 2) {
    }
    uVar4 = (ulong)((uint)(lVar2 + 1) & 3);
    lVar3 = (lVar2 - uVar4) + 5;
    if (uVar4 == 0) {
      lVar3 = lVar2 + 1;
    }
    this->currentchunk = puVar1 + lVar3;
    this->curchunknum = this->curchunknum + 1;
    this->itemoffset = 4;
    return true;
  }
  return false;
}

Assistant:

inline bool RTCPSDESPacket::GotoNextChunk()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	if (curchunknum == GetChunkCount())
		return false;
	
	size_t offset = sizeof(uint32_t);
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+sizeof(uint32_t));
	
	while (sdeshdr->sdesid != 0)
	{
		offset += sizeof(RTCPSDESHeader);
		offset += (size_t)(sdeshdr->length);
		sdeshdr = (RTCPSDESHeader *)(currentchunk+offset);
	}
	offset++; // for the zero byte
	if ((offset&0x03) != 0)
		offset += (4-(offset&0x03));
	currentchunk += offset;
	curchunknum++;
	itemoffset = sizeof(uint32_t);
	return true;
}